

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openglrenderer.h
# Opt level: O2

void __thiscall rengine::OpenGLRenderer::renderToLayer(OpenGLRenderer *this,Element *e)

{
  vec2 vVar1;
  vec2 vVar2;
  byte bVar3;
  uint uVar4;
  Node *pNVar5;
  vec2 step;
  vec2 textureSize;
  vec2 textureSize_00;
  GLuint GVar6;
  int iVar7;
  ostream *poVar8;
  long lVar9;
  long lVar10;
  mat4 *pmVar11;
  float *pfVar12;
  undefined8 *puVar13;
  mat4 *pmVar14;
  char *o;
  undefined1 *puVar15;
  mat4 *pmVar16;
  int h;
  byte bVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  rect2d r;
  mat4 in_stack_fffffffffffffbc8;
  undefined8 local_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 local_3d0;
  undefined4 local_3c8;
  undefined8 local_3c4;
  undefined8 uStack_3bc;
  undefined8 local_3b4;
  float local_3a8 [6];
  undefined8 local_390;
  undefined8 uStack_388;
  undefined4 local_380;
  undefined8 local_37c;
  undefined8 uStack_374;
  undefined8 local_36c;
  undefined8 local_360;
  undefined4 local_358;
  float local_354;
  undefined8 local_350;
  undefined4 local_348;
  float local_344;
  undefined8 local_340;
  undefined4 local_338;
  undefined8 local_334;
  undefined8 uStack_32c;
  undefined8 local_324;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined4 local_2f0;
  undefined8 local_2ec;
  undefined8 uStack_2e4;
  undefined8 local_2dc;
  float local_2d0 [6];
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined4 local_2a8;
  undefined8 local_2a4;
  undefined8 uStack_29c;
  undefined8 local_294;
  undefined8 local_288;
  undefined4 local_280;
  float local_27c;
  undefined8 local_278;
  undefined4 local_270;
  float local_26c;
  undefined8 local_268;
  undefined4 local_260;
  undefined8 local_25c;
  undefined8 uStack_254;
  undefined8 local_24c;
  float local_240 [2];
  mat4 storedProjection;
  mat4 local_1b8;
  mat4 local_174;
  mat4 local_130;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  vec2 local_d8;
  undefined8 uStack_d0;
  vec2 local_c8;
  undefined8 uStack_c0;
  vec2 local_b8;
  Node *local_b0;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  vec2 local_98;
  undefined8 uStack_90;
  mat4 *local_88;
  GLuint *local_80;
  TexturePool *local_78;
  Node *local_70;
  vec2 local_68;
  undefined8 uStack_60;
  GLuint local_4c;
  vec2 local_48;
  undefined8 uStack_40;
  uint local_38;
  byte local_31;
  
  bVar17 = 0;
  uVar4 = *(uint *)&e->field_0x18;
  if ((uVar4 >> 0x1e & 1) == 0) {
    __assert_fail("e->layered",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/scenegraph/openglrenderer.h"
                  ,0x2cf,"void rengine::OpenGLRenderer::renderToLayer(Element *)");
  }
  vVar1 = this->m_vertices[e->vboOffset];
  fVar18 = vVar1.y;
  vVar2 = this->m_vertices[e->vboOffset + 3];
  fVar21 = vVar2.y;
  fVar20 = vVar2.x - vVar1.x;
  if ((0.0 < fVar20) && (fVar19 = fVar21 - fVar18, 0.0 < fVar19)) {
    bVar3 = this->field_0x1f8;
    local_4c = this->m_fbo;
    pmVar11 = &this->m_proj;
    pfVar12 = local_240;
    for (lVar9 = 0x11; lVar9 != 0; lVar9 = lVar9 + -1) {
      *pfVar12 = pmVar11->m[0];
      pmVar11 = (mat4 *)(pmVar11->m + 1);
      pfVar12 = pfVar12 + 1;
    }
    local_b8 = this->m_surfaceSize;
    this->field_0x1f8 = (byte)(uVar4 >> 0x1d) & 3 | bVar3;
    pNVar5 = e->node;
    local_b0 = (Node *)0x0;
    if (pNVar5->field_0x30 == '\x04') {
      local_b0 = pNVar5;
    }
    local_70 = (Node *)0x0;
    if (pNVar5->field_0x30 == '\x05') {
      local_70 = pNVar5;
    }
    local_38 = CONCAT31(local_38._1_3_,local_b0 != (Node *)0x0 || local_70 != (Node *)0x0);
    if (local_b0 == (Node *)0x0 && local_70 == (Node *)0x0) {
      uStack_d0 = 0;
      uStack_c0 = 0;
      local_d8 = vVar2;
      local_c8 = vVar1;
      local_a8 = fVar18;
      local_98 = vVar1;
    }
    else {
      local_c8.x = vVar1.x + -1.0;
      local_c8.y = fVar18 + -1.0;
      local_d8.x = vVar2.x + 1.0;
      fVar20 = local_d8.x - local_c8.x;
      local_98.y = fVar18;
      local_98.x = local_c8.x;
      fVar19 = (fVar21 + 1.0) - local_c8.y;
      uStack_c0 = CONCAT44(fVar18,fVar18);
      local_d8.y = fVar21 + 1.0;
      uStack_d0 = CONCAT44(fVar21,fVar21);
      local_a8 = local_c8.y;
    }
    uStack_90 = 0;
    local_68.y = fVar21;
    local_68.x = fVar20;
    uStack_60 = 0;
    local_48.y = fVar21;
    local_48.x = fVar19;
    uStack_40 = CONCAT44(fVar21,fVar21);
    vVar1.y = fVar19;
    vVar1.x = fVar20;
    this->m_surfaceSize = vVar1;
    local_78 = &this->m_texturePool;
    local_e8 = fVar20;
    fStack_e4 = fVar19;
    fStack_e0 = fVar21;
    fStack_dc = fVar21;
    fStack_a4 = fVar18;
    fStack_a0 = fVar18;
    fStack_9c = fVar18;
    local_88 = &this->m_proj;
    local_31 = bVar3;
    GVar6 = TexturePool::acquire(local_78);
    e->texture = GVar6;
    rengine_create_texture(GVar6,(int)local_68.x,(int)local_48.x);
    local_80 = &this->m_fbo;
    glGenFramebuffers(1,&this->m_fbo);
    glBindFramebuffer(0x8d40,this->m_fbo);
    glFramebufferTexture2D(0x8d40,0x8ce0,0xde1,e->texture,0);
    iVar7 = glCheckFramebufferStatus(0x8d40);
    if (iVar7 != 0x8cd5) {
      poVar8 = std::operator<<((ostream *)&std::cerr,"W [");
      log_timestring_abi_cxx11_();
      poVar8 = std::operator<<(poVar8,(string *)&local_130);
      poVar8 = std::operator<<(poVar8,"]: ");
      poVar8 = std::operator<<(poVar8,"void rengine::OpenGLRenderer::renderToLayer(Element *)");
      poVar8 = std::operator<<(poVar8,": ");
      o = "FBO failed, devRect=";
      poVar8 = std::operator<<(poVar8,"FBO failed, devRect=");
      r.br = local_d8;
      r.tl = local_c8;
      poVar8 = operator<<((rengine *)poVar8,(ostream *)o,r);
      poVar8 = std::operator<<(poVar8,", dim=");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_68.x);
      poVar8 = std::operator<<(poVar8,"x");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_48.x);
      poVar8 = std::operator<<(poVar8,", tex=");
      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
      poVar8 = std::operator<<(poVar8,", fbo=");
      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
      poVar8 = std::operator<<(poVar8,", error=");
      *(uint *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x18) =
           *(uint *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x18) & 0xffffffb5 | 8;
      glCheckFramebufferStatus(0x8d40);
      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
      std::endl<char,std::char_traits<char>>(poVar8);
      std::__cxx11::string::~string((string *)&local_130);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/scenegraph/openglrenderer.h"
                    ,0x2fd,"void rengine::OpenGLRenderer::renderToLayer(Element *)");
    }
    local_1b8.m[0] = 1.0;
    local_1b8.m[1] = 0.0;
    local_1b8.m[2] = 0.0;
    local_1b8.m[3] = 0.0;
    local_1b8.m[4] = 0.0;
    local_1b8.m[5] = -1.0;
    local_1b8.m[6] = 0.0;
    local_1b8.m[7] = 0.0;
    local_1b8.m[8] = 0.0;
    local_1b8.m[9] = 0.0;
    local_1b8.m[10] = 1.0;
    local_1b8.m[0xb] = 0.0;
    local_1b8.m[0xc] = 0.0;
    local_1b8.m[0xd] = 0.0;
    local_1b8.m[0xe] = 0.0;
    local_1b8.m[0xf] = 1.0;
    local_1b8.type = 2;
    local_3f0 = 0x3f800000;
    uStack_3e8 = 0xbf80000000000000;
    local_3e0 = 0x3f80000000000000;
    uStack_3d8 = 0x3f80000000000000;
    local_3d0 = 0;
    local_3c8 = 0x3f800000;
    local_3c4 = 0;
    uStack_3bc = 0;
    local_3b4 = 0x13f800000;
    lVar9 = 0x44;
    puVar13 = &local_3f0;
    puVar15 = &stack0xfffffffffffffbc8;
    for (lVar10 = lVar9; lVar10 != 0; lVar10 = lVar10 + -1) {
      *puVar15 = *(undefined1 *)puVar13;
      puVar13 = (undefined8 *)((long)puVar13 + (ulong)bVar17 * -2 + 1);
      puVar15 = puVar15 + (ulong)bVar17 * -2 + 1;
    }
    mat4::operator*(&local_174,&local_1b8,in_stack_fffffffffffffbc8);
    local_3a8[0] = 2.0 / local_68.x;
    local_3a8[1] = 0.0;
    local_3a8[2] = 0.0;
    local_3a8[3] = 0.0;
    local_3a8[4] = 0.0;
    local_3a8[5] = -2.0 / local_48.x;
    local_390 = 0;
    uStack_388 = 0;
    local_380 = 0x3f800000;
    local_37c = 0;
    uStack_374 = 0;
    local_36c = 0x23f800000;
    pfVar12 = local_3a8;
    puVar15 = &stack0xfffffffffffffbc8;
    for (lVar10 = lVar9; lVar10 != 0; lVar10 = lVar10 + -1) {
      *puVar15 = *(undefined1 *)pfVar12;
      pfVar12 = (float *)((long)pfVar12 + (ulong)bVar17 * -2 + 1);
      puVar15 = puVar15 + (ulong)bVar17 * -2 + 1;
    }
    mat4::operator*((mat4 *)(storedProjection.m + 0xf),&local_174,in_stack_fffffffffffffbc8);
    local_360 = 0x3f800000;
    local_358 = 0;
    local_354 = -local_98.x;
    local_350 = 0x3f80000000000000;
    local_348 = 0;
    local_344 = -local_a8;
    local_340 = 0;
    local_338 = 0x3f800000;
    local_334 = 0;
    uStack_32c = 0;
    local_324 = 0x13f800000;
    puVar13 = &local_360;
    puVar15 = &stack0xfffffffffffffbc8;
    for (; lVar9 != 0; lVar9 = lVar9 + -1) {
      *puVar15 = *(undefined1 *)puVar13;
      puVar13 = (undefined8 *)((long)puVar13 + (ulong)bVar17 * -2 + 1);
      puVar15 = puVar15 + (ulong)bVar17 * -2 + 1;
    }
    mat4::operator*(&local_130,(mat4 *)(storedProjection.m + 0xf),in_stack_fffffffffffffbc8);
    pmVar11 = local_88;
    pmVar14 = &local_130;
    pmVar16 = local_88;
    for (lVar9 = 0x11; lVar9 != 0; lVar9 = lVar9 + -1) {
      pmVar16->m[0] = pmVar14->m[0];
      pmVar14 = (mat4 *)((long)pmVar14 + (ulong)bVar17 * -8 + 4);
      pmVar16 = (mat4 *)((long)pmVar16 + (ulong)bVar17 * -8 + 4);
    }
    this->m_matrixState = 0xffffffff;
    glClearColor(0,0,0,0);
    glClear(0x4000);
    render(this,e + 1,e + (ulong)(*(uint *)&e->field_0x18 & 0x1fffffff) + 1);
    if ((char)local_38 != '\0') {
      local_38 = e->texture;
      GVar6 = TexturePool::acquire(local_78);
      e->texture = GVar6;
      local_68 = this->m_vertices[e->vboOffset + 4];
      uStack_60 = 0;
      local_48 = this->m_vertices[e->vboOffset + 7];
      uStack_40 = 0;
      local_1b8.m[0] = 1.0;
      local_1b8.m[1] = 0.0;
      local_1b8.m[2] = 0.0;
      local_1b8.m[3] = 0.0;
      local_1b8.m[4] = 0.0;
      local_1b8.m[5] = -1.0;
      local_1b8.m[6] = 0.0;
      local_1b8.m[7] = 0.0;
      local_1b8.m[8] = 0.0;
      local_1b8.m[9] = 0.0;
      local_1b8.m[10] = 1.0;
      local_1b8.m[0xb] = 0.0;
      local_1b8.m[0xc] = 0.0;
      local_1b8.m[0xd] = 0.0;
      local_1b8.m[0xe] = 0.0;
      local_318 = 0x3f800000;
      uStack_310 = 0xbf80000000000000;
      local_308 = 0x3f80000000000000;
      uStack_300 = 0x3f80000000000000;
      local_2f8 = 0;
      local_1b8.m[0xf] = 1.0;
      local_1b8.type = 2;
      local_2f0 = 0x3f800000;
      local_2ec = 0;
      uStack_2e4 = 0;
      local_2dc = 0x13f800000;
      lVar9 = 0x44;
      puVar13 = &local_318;
      puVar15 = &stack0xfffffffffffffbc8;
      for (lVar10 = lVar9; lVar10 != 0; lVar10 = lVar10 + -1) {
        *puVar15 = *(undefined1 *)puVar13;
        puVar13 = (undefined8 *)((long)puVar13 + (ulong)bVar17 * -2 + 1);
        puVar15 = puVar15 + (ulong)bVar17 * -2 + 1;
      }
      mat4::operator*(&local_174,&local_1b8,in_stack_fffffffffffffbc8);
      local_48.x = local_48.x - local_68.x;
      local_48.y = local_48.y - local_68.y;
      uStack_40 = CONCAT44(uStack_40._4_4_ - uStack_60._4_4_,(float)uStack_40 - (float)uStack_60);
      local_a8 = local_48.y;
      fStack_a4 = local_48.y;
      fStack_a0 = local_48.y;
      fStack_9c = local_48.y;
      local_98.y = local_68.y;
      local_98.x = local_68.y;
      uStack_90 = CONCAT44(local_68.y,local_68.y);
      local_2d0[0] = 2.0 / local_48.x;
      local_2d0[1] = 0.0;
      local_2d0[2] = 0.0;
      local_2d0[3] = 0.0;
      local_2d0[4] = 0.0;
      local_2d0[5] = -2.0 / local_48.y;
      local_2b8 = 0;
      uStack_2b0 = 0;
      local_2a8 = 0x3f800000;
      local_2a4 = 0;
      uStack_29c = 0;
      local_294 = 0x23f800000;
      pfVar12 = local_2d0;
      puVar15 = &stack0xfffffffffffffbc8;
      for (; lVar9 != 0; lVar9 = lVar9 + -1) {
        *puVar15 = *(undefined1 *)pfVar12;
        pfVar12 = (float *)((long)pfVar12 + (ulong)bVar17 * -2 + 1);
        puVar15 = puVar15 + (ulong)bVar17 * -2 + 1;
      }
      mat4::operator*((mat4 *)(storedProjection.m + 0xf),&local_174,in_stack_fffffffffffffbc8);
      pmVar11 = local_88;
      local_288 = 0x3f800000;
      local_280 = 0;
      local_27c = -local_68.x;
      local_278 = 0x3f80000000000000;
      local_270 = 0;
      local_26c = -local_98.x;
      local_268 = 0;
      local_260 = 0x3f800000;
      local_25c = 0;
      uStack_254 = 0;
      local_24c = 0x13f800000;
      puVar13 = &local_288;
      puVar15 = &stack0xfffffffffffffbc8;
      for (lVar9 = 0x44; lVar9 != 0; lVar9 = lVar9 + -1) {
        *puVar15 = *(undefined1 *)puVar13;
        puVar13 = (undefined8 *)((long)puVar13 + (ulong)bVar17 * -2 + 1);
        puVar15 = puVar15 + (ulong)bVar17 * -2 + 1;
      }
      mat4::operator*(&local_130,(mat4 *)(storedProjection.m + 0xf),in_stack_fffffffffffffbc8);
      pmVar14 = &local_130;
      pmVar16 = pmVar11;
      for (lVar9 = 0x11; lVar9 != 0; lVar9 = lVar9 + -1) {
        pmVar16->m[0] = pmVar14->m[0];
        pmVar14 = (mat4 *)((long)pmVar14 + (ulong)bVar17 * -8 + 4);
        pmVar16 = (mat4 *)((long)pmVar16 + (ulong)bVar17 * -8 + 4);
      }
      this->m_matrixState = 0xffffffff;
      iVar7 = (int)local_48.x;
      h = (int)local_a8;
      rengine_create_texture(e->texture,iVar7,h);
      glFramebufferTexture2D(0x8d40,0x8ce0,0xde1,e->texture,0);
      glClear(0x4000);
      glViewport(0,0,iVar7,h);
      uVar4 = local_38;
      if (local_b0 == (Node *)0x0) {
        if (local_70 != (Node *)0x0) {
          textureSize_00.y = fStack_e4;
          textureSize_00.x = local_e8;
          vVar2.y = 0.0;
          vVar2.x = 1.0 / local_48.x;
          drawShadowQuad(this,e->vboOffset + 4,local_38,*(int *)&local_70->field_0x34,local_48,
                         textureSize_00,vVar2,(vec4)(ZEXT816(0x3f80000000000000) << 0x40));
          e->sourceTexture = uVar4;
        }
      }
      else {
        textureSize.y = fStack_e4;
        textureSize.x = local_e8;
        step.y = 0.0;
        step.x = 1.0 / local_48.x;
        drawBlurQuad(this,e->vboOffset + 4,local_38,*(int *)&local_b0->field_0x34,local_48,
                     textureSize,step);
        TexturePool::release(local_78,uVar4);
      }
    }
    glBindFramebuffer(0x8d40,this->m_fbo);
    glFramebufferTexture2D(0x8d40,0x8ce0,0xde1,0,0);
    GVar6 = local_4c;
    glBindFramebuffer(0x8d40,local_4c);
    glDeleteFramebuffers(1,local_80);
    this->m_fbo = GVar6;
    this->field_0x1f8 = local_31 & 3 | this->field_0x1f8 & 0xfc;
    pfVar12 = local_240;
    for (lVar9 = 0x11; lVar9 != 0; lVar9 = lVar9 + -1) {
      pmVar11->m[0] = *pfVar12;
      pfVar12 = pfVar12 + (ulong)bVar17 * -2 + 1;
      pmVar11 = (mat4 *)((long)pmVar11 + (ulong)bVar17 * -8 + 4);
    }
    this->m_matrixState = 0xffffffff;
    this->m_surfaceSize = local_b8;
  }
  return;
}

Assistant:

inline void OpenGLRenderer::renderToLayer(Element *e)
{
    // string space;
    // for (int i=0; i<recursion; ++i)
    //     space += "    ";
    // std::cout << space << "- doing layered rendering for: element=" << e << " node=" << e->node << std::endl;
    assert(e->layered);

    // Create the FBO
    rect2d devRect = boundingRectFor(e->vboOffset);

    // Abort the render to layer pass if the dev rect happens to be zero..
    if (devRect.width() <= 0 || devRect.height() <= 0) {
        return;
    }

    // Store current state...
    bool stored3d = m_render3d;
    bool storedTextureed = m_layered;
    GLuint storedFbo = m_fbo;
    mat4 storedProjection = m_proj;
    vec2 storedSize = m_surfaceSize;

    m_render3d |= e->projection;
    m_layered = true;


    BlurNode *blurNode = BlurNode::from(e->node);
    ShadowNode *shadowNode = ShadowNode::from(e->node);

    if (blurNode || shadowNode) {
        devRect.tl -= 1.0f;
        devRect.br += 1.0f;
    }

    // std::cout << space << " ---> from " << e->vboOffset << " " << m_vertices[e->vboOffset] << " " << m_vertices[e->vboOffset+3] << std::endl;

    m_surfaceSize = devRect.size();

    e->texture = m_texturePool.acquire();
    rengine_create_texture(e->texture, devRect.width(), devRect.height());

    glGenFramebuffers(1, &m_fbo);
    glBindFramebuffer(GL_FRAMEBUFFER, m_fbo);
    glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, e->texture, 0);

#ifndef NDEBUG
    // Only enabled in debug mode because it syncs the GL stack and takes forever..
    if (glCheckFramebufferStatus(GL_FRAMEBUFFER) != GL_FRAMEBUFFER_COMPLETE) {
        logw << "FBO failed, devRect=" << devRect
             << ", dim=" << devRect.width() << "x" << devRect.height() << ", tex=" << e->texture << ", fbo=" << m_fbo << ", error="
             << std::hex << glCheckFramebufferStatus(GL_FRAMEBUFFER) << std::endl;
        assert(false);
    }
#endif

    // Render the layered group
    m_proj = mat4::scale2D(1.0, -1.0)
             * mat4::translate2D(-1.0, 1.0)
             * mat4::scale2D(2.0f / devRect.width(), -2.0f / devRect.height())
             * mat4::translate2D(-devRect.tl.x, -devRect.tl.y);
    m_matrixState = UpdateAllPrograms;

    // std::cout << " ---> rect=" << devRect << " texture=" << e->texture << " fbo=" << m_fbo
    //           << " status=" << hex << glCheckFramebufferStatus(GL_FRAMEBUFFER) << " ok=" << GL_FRAMEBUFFER_COMPLETE
    //           << " " << m_proj << std::endl;

    glClearColor(0, 0, 0, 0);
    glClear(GL_COLOR_BUFFER_BIT);
    render(e + 1, e + e->groupSize + 1);

    if (blurNode || shadowNode) {
        int tmpTex = e->texture;
        e->texture = m_texturePool.acquire();
        rect2d expandedWidth = boundingRectFor(e->vboOffset + 4);
        m_proj = mat4::scale2D(1.0, -1.0)
                 * mat4::translate2D(-1.0, 1.0)
                 * mat4::scale2D(2.0f / expandedWidth.width(), -2.0f / expandedWidth.height())
                 * mat4::translate2D(-expandedWidth.tl.x, -expandedWidth.tl.y);
        m_matrixState = UpdateAllPrograms;
        rengine_create_texture(e->texture, expandedWidth.width(), expandedWidth.height());
        glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, e->texture, 0);
        glClear(GL_COLOR_BUFFER_BIT);
        glViewport(0, 0, expandedWidth.width(), expandedWidth.height());
        if (blurNode) {
            drawBlurQuad(e->vboOffset + 4, tmpTex, blurNode->radius(), expandedWidth.size(), devRect.size(), vec2(1/expandedWidth.width(), 0));
            m_texturePool.release(tmpTex);
        } else if (shadowNode) {
            drawShadowQuad(e->vboOffset + 4, tmpTex, shadowNode->radius(), expandedWidth.size(), devRect.size(), vec2(1/expandedWidth.width(), 0), vec4(0, 0, 0, 1));
            e->sourceTexture = tmpTex;
        }
    }

    // Reset the GL state..
    glBindFramebuffer(GL_FRAMEBUFFER, m_fbo);
    glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, 0, 0);
    glBindFramebuffer(GL_FRAMEBUFFER, storedFbo);
    glDeleteFramebuffers(1, &m_fbo);

    // Reset the old state...
    m_fbo = storedFbo;
    m_render3d = stored3d;
    m_layered = storedTextureed;
    m_proj = storedProjection;
    m_matrixState = UpdateAllPrograms;
    m_surfaceSize = storedSize;

    // std::cout << space << "- layer is completed..." << std::endl;
}